

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

void Ree_ManCutMerge(Gia_Man_t *p,int iObj,int *pList0,int *pList1,Vec_Int_t *vCuts,
                    Hash_IntMan_t *pHash,Vec_Int_t *vData,Vec_Int_t *vXors)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_EAX;
  int *piVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint *pCut0;
  undefined1 auVar15 [16];
  uint local_c4;
  uint local_bc;
  uint local_b8 [7];
  int local_9c;
  Vec_Int_t *local_98;
  ulong local_90;
  int local_88;
  int local_84;
  int *local_80;
  Vec_Int_t *local_78;
  int *local_70;
  int *local_68;
  ulong local_60;
  Vec_Int_t *local_58;
  Hash_IntMan_t *local_50;
  ulong local_48;
  Gia_Man_t *local_40;
  ulong local_38;
  
  local_58 = vData;
  piVar5 = vCuts->pArray;
  local_50 = pHash;
  local_40 = p;
  if (vCuts->nCap < 2) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(8);
    }
    else {
      piVar5 = (int *)realloc(piVar5,8);
    }
    vCuts->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vCuts->nCap = 2;
  }
  piVar5[0] = 1;
  piVar5[1] = 1;
  vCuts->nSize = 2;
  Vec_IntPush(vCuts,iObj);
  Vec_IntPush(vCuts,0xaa);
  iVar14 = *pList0;
  if (0 < iVar14) {
    local_78 = vXors;
    local_70 = pList0;
    pCut0 = (uint *)(pList0 + 1);
    local_68 = pList1 + 1;
    local_48 = (ulong)(uint)iObj;
    iVar13 = *pList1;
    uVar11 = 0;
    local_c4 = 0xffffffff;
    local_bc = 0xffffffff;
    local_98 = vCuts;
    local_80 = pList1;
    do {
      if (0 < iVar13) {
        local_60 = uVar11;
        iVar14 = 0;
        piVar5 = local_68;
        do {
          iVar13 = *piVar5;
          if (-1 < (long)iVar13) {
            memcpy(local_b8,piVar5,(long)iVar13 * 4 + 4);
          }
          uVar9 = *pCut0;
          if (0 < (int)uVar9) {
            lVar8 = 1;
            do {
              if (0 < iVar13) {
                uVar11 = 1;
                do {
                  if (pCut0[lVar8] == piVar5[uVar11]) goto LAB_0066f0ce;
                  uVar11 = uVar11 + 1;
                } while (iVar13 + 1 != uVar11);
              }
              lVar10 = (long)(int)local_b8[0];
              if (lVar10 == 3) goto LAB_0066f3b3;
              local_b8[0] = local_b8[0] + 1;
              local_b8[lVar10 + 1] = pCut0[lVar8];
LAB_0066f0ce:
              lVar8 = lVar8 + 1;
            } while (lVar8 != (ulong)uVar9 + 1);
          }
          uVar11 = local_48;
          uVar9 = local_b8[1];
          if ((local_b8[0] & 0xfffffffe) != 2) {
            __assert_fail("pCut[0] == 2 || pCut[0] == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x70,"int Ree_ManCutMergeOne(int *, int *, int *)");
          }
          if ((int)local_b8[2] < (int)local_b8[1]) {
            local_b8[1] = local_b8[2];
            local_b8[2] = uVar9;
          }
          uVar3 = local_b8[2];
          uVar9 = local_b8[1];
          if ((int)local_b8[2] <= (int)local_b8[1]) {
            __assert_fail("pCut[1] < pCut[2]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x73,"int Ree_ManCutMergeOne(int *, int *, int *)");
          }
          if (local_b8[0] != 2) {
            if ((int)local_b8[3] < (int)local_b8[2]) {
              local_b8[2] = local_b8[3];
              local_b8[3] = uVar3;
            }
            if ((int)local_b8[2] < (int)local_b8[1]) {
              local_b8[1] = local_b8[2];
              local_b8[2] = uVar9;
            }
            if ((int)local_b8[2] <= (int)local_b8[1]) {
              __assert_fail("pCut[1] < pCut[2]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                            ,0x7a,"int Ree_ManCutMergeOne(int *, int *, int *)");
            }
            if ((int)local_b8[3] <= (int)local_b8[2]) {
              __assert_fail("pCut[2] < pCut[3]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                            ,0x7b,"int Ree_ManCutMergeOne(int *, int *, int *)");
            }
          }
          iVar13 = *vCuts->pArray;
          if (0 < iVar13) {
            puVar6 = (uint *)(vCuts->pArray + 1);
            iVar7 = 0;
            do {
              uVar9 = *puVar6;
              if ((int)uVar9 < 0) goto LAB_0066f3b3;
              lVar8 = 0;
              while (puVar6[lVar8] == local_b8[lVar8]) {
                lVar8 = lVar8 + 1;
                if ((ulong)uVar9 + 1 == lVar8) goto LAB_0066f3b3;
              }
              iVar7 = iVar7 + 1;
              puVar6 = puVar6 + (ulong)uVar9 + 2;
            } while (iVar7 != iVar13);
          }
          if ((iObj < 0) || (local_40->nObjs <= iObj)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar1 = local_40->pObjs;
          local_9c = iVar14;
          local_88 = local_b8[1];
          local_84 = local_b8[2];
          uVar3 = Ree_ManCutTruthOne((int *)pCut0,(int *)local_b8);
          uVar4 = Ree_ManCutTruthOne(piVar5,(int *)local_b8);
          pVVar2 = local_98;
          lVar8 = *(long *)(pGVar1 + uVar11);
          uVar9 = (uint)lVar8;
          uVar3 = (int)(uVar9 * 4) >> 0x1f ^ uVar3;
          uVar4 = (uint)(lVar8 * 4 >> 0x3f) ^ uVar4;
          if ((int)uVar9 < 0 || (~uVar9 & 0x1fffffff) == 0) {
            uVar12 = uVar3 & uVar4;
          }
          else {
            uVar12 = uVar3 & uVar4;
            if ((uVar9 & 0x1fffffff) < ((uint)((ulong)lVar8 >> 0x20) & 0x1fffffff)) {
              uVar12 = uVar3 ^ uVar4;
            }
          }
          uVar12 = uVar12 & 0xff;
          uVar9 = uVar12 ^ 0xff;
          if (uVar12 < 0x80) {
            uVar9 = uVar12;
          }
          if ((uVar9 == 0x66) && (local_bc == 0xffffffff)) {
            uVar3 = local_98->nSize;
            local_bc = uVar3;
          }
          else {
            uVar3 = local_98->nSize;
            if (local_c4 == 0xffffffff && uVar9 == 0x69) {
              local_c4 = uVar3;
            }
          }
          local_38 = (ulong)uVar9;
          if ((int)uVar3 < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          *local_98->pArray = *local_98->pArray + 1;
          uVar11 = (ulong)local_b8[0];
          local_90 = uVar11;
          if (-1 < (int)local_b8[0]) {
            lVar8 = 0;
            do {
              Vec_IntPush(pVVar2,local_b8[lVar8]);
              lVar8 = lVar8 + 1;
            } while (uVar11 + 1 != lVar8);
          }
          iVar13 = (int)local_38;
          Vec_IntPush(pVVar2,uVar12);
          auVar15._0_4_ = -(uint)(iVar13 == 0x11);
          auVar15._4_4_ = -(uint)(iVar13 == 0x22);
          auVar15._8_4_ = -(uint)(iVar13 == 0x44);
          auVar15._12_4_ = -(uint)(iVar13 == 0x77);
          iVar14 = movmskps(extraout_EAX,auVar15);
          uVar9 = 0;
          if (iVar14 == 0 && iVar13 != 0x66 || (int)local_90 != 2) {
            if ((((iVar13 - 0x17U < 0x37) &&
                 ((0x40000000100001U >> ((ulong)(iVar13 - 0x17U) & 0x3f) & 1) != 0)) ||
                (iVar13 == 0x71)) ||
               (pList1 = local_80, vCuts = local_98, iVar14 = local_9c, iVar13 == 0x69)) {
              uVar9 = local_b8[3];
              if ((int)local_90 != 3) {
                __assert_fail("pCut[0] == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                              ,0x127,
                              "void Ree_ManCutMerge(Gia_Man_t *, int, int *, int *, Vec_Int_t *, Hash_IntMan_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              goto LAB_0066f36b;
            }
          }
          else {
LAB_0066f36b:
            iVar14 = Hsh_Int3ManInsert(local_50,local_88,local_84,uVar9);
            pVVar2 = local_58;
            Vec_IntPush(local_58,iObj);
            Vec_IntPush(pVVar2,iVar14);
            Vec_IntPush(pVVar2,uVar12);
            pList1 = local_80;
            vCuts = local_98;
            iVar14 = local_9c;
          }
LAB_0066f3b3:
          iVar14 = iVar14 + 1;
          piVar5 = piVar5 + (long)*piVar5 + 2;
          iVar13 = *pList1;
        } while (iVar14 < iVar13);
        iVar14 = *local_70;
        uVar11 = local_60;
      }
      pVVar2 = local_78;
      uVar9 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar9;
      pCut0 = pCut0 + (long)(int)*pCut0 + 2;
    } while ((int)uVar9 < iVar14);
    if (local_78 != (Vec_Int_t *)0x0) {
      if ((int)local_bc < 1) {
        if ((int)local_c4 < 1) {
          return;
        }
        local_bc = local_c4;
        if (vCuts->nSize <= (int)local_c4) goto LAB_0066f47a;
      }
      else if (vCuts->nSize <= (int)local_bc) {
LAB_0066f47a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar5 = vCuts->pArray;
      uVar11 = (ulong)local_bc;
      Vec_IntPush(local_78,iObj);
      if (0 < piVar5[uVar11]) {
        lVar8 = 0;
        do {
          Vec_IntPush(pVVar2,piVar5[uVar11 + lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < piVar5[uVar11]);
        if (piVar5[uVar11] == 2) {
          Vec_IntPush(pVVar2,0);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Ree_ManCutMerge( Gia_Man_t * p, int iObj, int * pList0, int * pList1, Vec_Int_t * vCuts, Hash_IntMan_t * pHash, Vec_Int_t * vData, Vec_Int_t * vXors )
{
    int fVerbose = 0;
    int i, k, c, Value, Truth, TruthC, * pCut0, * pCut1, pCut[6], Count = 0;
    int iXor2 = -1, iXor3 = -1;
    if ( fVerbose )
        printf( "Object %d\n", iObj );
    Vec_IntFill( vCuts, 2, 1 );
    Vec_IntPush( vCuts, iObj );
    Vec_IntPush( vCuts, 0xAA );
    Ree_ForEachCut( pList0, pCut0, i )
    Ree_ForEachCut( pList1, pCut1, k )
    {
        if ( !Ree_ManCutMergeOne(pCut0, pCut1, pCut) )
            continue;
        if ( Ree_ManCutCheckEqual(vCuts, pCut) )
            continue;
        Truth = TruthC = Ree_ManCutTruth(Gia_ManObj(p, iObj), pCut0, pCut1, pCut);
        //assert( Truth == Ree_ObjComputeTruth(p, iObj, pCut) );
        if ( Truth & 0x80 )
            Truth = 0xFF & ~Truth;
        if ( Truth == 0x66 && iXor2 == -1 )
            iXor2 = Vec_IntSize(vCuts);
        else if ( Truth == 0x69 && iXor3 == -1 )
            iXor3 = Vec_IntSize(vCuts);
        Vec_IntAddToEntry( vCuts, 0, 1 );  
        for ( c = 0; c <= pCut[0]; c++ )
            Vec_IntPush( vCuts, pCut[c] );
        Vec_IntPush( vCuts, TruthC );
        if ( (Truth == 0x66 || Truth == 0x11 || Truth == 0x22 || Truth == 0x44 || Truth == 0x77) && pCut[0] == 2 )
        {
            assert( pCut[0] == 2 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], 0 );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        else if ( Truth == 0x69 || Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x71 )
        {
            assert( pCut[0] == 3 );
            Value = Hsh_Int3ManInsert( pHash, pCut[1], pCut[2], pCut[3] );
            Vec_IntPushThree( vData, iObj, Value, TruthC );
        }
        if ( fVerbose )
            Ree_ManCutPrint( pCut, ++Count, TruthC, iObj );
    }
    if ( !vXors )
        return;
    if ( iXor2 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor2 );
    else if ( iXor3 > 0 )
        pCut0 = Vec_IntEntryP( vCuts, iXor3 );
    else
        return;
    Vec_IntPush( vXors, iObj );
    for ( c = 1; c <= pCut0[0]; c++ )
        Vec_IntPush( vXors, pCut0[c] );
    if ( pCut0[0] == 2 )
        Vec_IntPush( vXors, 0 );
}